

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rpf_reader.cpp
# Opt level: O1

vector<Mirror,_std::allocator<Mirror>_> * __thiscall
RPF_reader::load_rpf_2
          (vector<Mirror,_std::allocator<Mirror>_> *__return_storage_ptr__,RPF_reader *this,
          string *file_to_read)

{
  int *piVar1;
  char cVar2;
  int iVar3;
  istream *piVar4;
  stringstream local_4f8 [8];
  stringstream ss;
  ostream local_4e8 [112];
  ios_base local_478 [264];
  long local_370;
  ifstream inFile;
  byte abStack_350 [488];
  undefined1 local_168 [8];
  Point_d sample_position;
  Mirror incomming_mirror;
  Point_d m_position;
  Point_d displayed_sample;
  string keyword;
  string line;
  int id;
  
  std::ifstream::ifstream(&local_370);
  keyword.field_2._8_8_ = &line._M_string_length;
  line._M_dataplus._M_p = (pointer)0x0;
  line._M_string_length._0_1_ = 0;
  (__return_storage_ptr__->super__Vector_base<Mirror,_std::allocator<Mirror>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<Mirror,_std::allocator<Mirror>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<Mirror,_std::allocator<Mirror>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  Point_d::Point_d((Point_d *)
                   &incomming_mirror._disp_pixels.
                    super__Vector_base<Pixel_d,_std::allocator<Pixel_d>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage,999999.0,99999.0,99999.0,9999999);
  Point_d::Point_d((Point_d *)&m_position.id,999999.0,99999.0,99999.0,9999999);
  Point_d::Point_d((Point_d *)local_168,999999.0,99999.0,99999.0,9999999);
  std::ifstream::open((string *)&local_370,(_Ios_Openmode)file_to_read);
  if ((abStack_350[*(long *)(local_370 + -0x18)] & 5) == 0) {
    piVar1 = &displayed_sample.id;
    while( true ) {
      cVar2 = std::ios::widen((char)*(undefined8 *)(local_370 + -0x18) + (char)(istream *)&local_370
                             );
      piVar4 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                         ((istream *)&local_370,(string *)(keyword.field_2._M_local_buf + 8),cVar2);
      if (((byte)piVar4[*(long *)(*(long *)piVar4 + -0x18) + 0x20] & 5) != 0) break;
      std::__cxx11::stringstream::stringstream(local_4f8);
      keyword._M_dataplus._M_p = (pointer)0x0;
      keyword._M_string_length._0_1_ = 0;
      displayed_sample._24_8_ = &keyword._M_string_length;
      std::__ostream_insert<char,std::char_traits<char>>
                (local_4e8,(char *)keyword.field_2._8_8_,(long)line._M_dataplus._M_p);
      std::operator>>((istream *)local_4f8,(string *)piVar1);
      iVar3 = std::__cxx11::string::compare((char *)piVar1);
      if (iVar3 == 0) {
        std::istream::operator>>((istream *)local_4f8,(int *)(line.field_2._M_local_buf + 0xc));
      }
      iVar3 = std::__cxx11::string::compare((char *)piVar1);
      if (iVar3 == 0) {
        std::istream::_M_extract<double>((double *)local_4f8);
        std::istream::_M_extract<double>((double *)local_4f8);
        std::istream::_M_extract<double>((double *)local_4f8);
      }
      iVar3 = std::__cxx11::string::compare((char *)piVar1);
      if (iVar3 == 0) {
        std::istream::_M_extract<double>((double *)local_4f8);
        std::istream::_M_extract<double>((double *)local_4f8);
        std::istream::_M_extract<double>((double *)local_4f8);
      }
      iVar3 = std::__cxx11::string::compare((char *)piVar1);
      if (iVar3 == 0) {
        Point_d::Point_d((Point_d *)&incomming_mirror,999999.0,99999.0,99999.0,9999999);
        incomming_mirror._matching_samples.super__Vector_base<Point_d,_std::allocator<Point_d>_>.
        _M_impl.super__Vector_impl_data._M_finish._0_4_ = 0;
        incomming_mirror._matching_samples.super__Vector_base<Point_d,_std::allocator<Point_d>_>.
        _M_impl.super__Vector_impl_data._M_finish._4_4_ = 0;
        incomming_mirror._matching_samples.super__Vector_base<Point_d,_std::allocator<Point_d>_>.
        _M_impl.super__Vector_impl_data._M_end_of_storage._0_4_ = 0;
        incomming_mirror._position.id = 0;
        incomming_mirror._position._28_4_ = 0;
        incomming_mirror._matching_samples.super__Vector_base<Point_d,_std::allocator<Point_d>_>.
        _M_impl.super__Vector_impl_data._M_start._0_4_ = 0;
        incomming_mirror._matching_samples.super__Vector_base<Point_d,_std::allocator<Point_d>_>.
        _M_impl.super__Vector_impl_data._M_start._4_4_ = 0;
        Point_d::Point_d((Point_d *)&incomming_mirror._ammount_of_matching_samples,999999.0,99999.0,
                         99999.0,9999999);
        incomming_mirror._displayed_sample.id._0_1_ = 0;
        incomming_mirror.has_sample = false;
        incomming_mirror._105_3_ = 0;
        incomming_mirror._am_disp_pixels = 0;
        incomming_mirror._disp_pixels.super__Vector_base<Pixel_d,_std::allocator<Pixel_d>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        incomming_mirror._disp_pixels.super__Vector_base<Pixel_d,_std::allocator<Pixel_d>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)0x0;
        sample_position.id = line.field_2._12_4_;
        incomming_mirror._position._12_8_ = m_position._12_8_;
        incomming_mirror._0_8_ =
             incomming_mirror._disp_pixels.super__Vector_base<Pixel_d,_std::allocator<Pixel_d>_>.
             _M_impl.super__Vector_impl_data._M_end_of_storage;
        incomming_mirror._displayed_sample._12_8_ = displayed_sample._12_8_;
        incomming_mirror._ammount_of_matching_samples = m_position.id;
        incomming_mirror._68_4_ = m_position._28_4_;
        std::vector<Mirror,_std::allocator<Mirror>_>::push_back
                  (__return_storage_ptr__,(value_type *)&sample_position.id);
        if (incomming_mirror._104_8_ != 0) {
          operator_delete((void *)incomming_mirror._104_8_,
                          (long)incomming_mirror._disp_pixels.
                                super__Vector_base<Pixel_d,_std::allocator<Pixel_d>_>._M_impl.
                                super__Vector_impl_data._M_finish - incomming_mirror._104_8_);
        }
        if (incomming_mirror._position._24_8_ != 0) {
          operator_delete((void *)incomming_mirror._position._24_8_,
                          CONCAT44(incomming_mirror._matching_samples.
                                   super__Vector_base<Point_d,_std::allocator<Point_d>_>._M_impl.
                                   super__Vector_impl_data._M_finish._4_4_,
                                   incomming_mirror._matching_samples.
                                   super__Vector_base<Point_d,_std::allocator<Point_d>_>._M_impl.
                                   super__Vector_impl_data._M_finish._0_4_) -
                          incomming_mirror._position._24_8_);
        }
      }
      if ((size_type *)displayed_sample._24_8_ != &keyword._M_string_length) {
        operator_delete((void *)displayed_sample._24_8_,
                        CONCAT71(keyword._M_string_length._1_7_,(undefined1)keyword._M_string_length
                                ) + 1);
      }
      std::__cxx11::stringstream::~stringstream(local_4f8);
      std::ios_base::~ios_base(local_478);
    }
    if ((size_type *)keyword.field_2._8_8_ != &line._M_string_length) {
      operator_delete((void *)keyword.field_2._8_8_,
                      CONCAT71(line._M_string_length._1_7_,(undefined1)line._M_string_length) + 1);
    }
    std::ifstream::~ifstream(&local_370);
    return __return_storage_ptr__;
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cerr,"Unable to open file ",0x14);
  std::operator<<((ostream *)&std::cerr,(string *)file_to_read);
  exit(1);
}

Assistant:

std::vector<Mirror> RPF_reader::load_rpf_2(std::string const& file_to_read){
    std::ifstream inFile;
    std::string line;
    std::vector<Mirror> loadedMirrors;
    Point_d m_position;
    Point_d displayed_sample;
    std::vector<Point_d> sampled_positions;
    Point_d sample_position;


    inFile.open(file_to_read);
    if (!inFile) {
        std::cerr << "Unable to open file "<<file_to_read;
        exit(1);   // call system to stop
    }
    else{
      while(std::getline(inFile, line)){

        std::stringstream ss;
        std::string keyword;


        //------------------------------------------------------
        //------------------------------------------------------
  /*
        int id;
        Point_d _position;
        std::vector<Point_d> _matching_samples;
        // value ammount of _matching_samples  not used???
        int _ammount_of_matching_samples = 0;
        Point_d _displayed_sample;
        bool has_sample = false;
        */
        //------------------------------------------------------
        //------------------------------------------------------

        ss << line;
        ss >> keyword;


        int id;

        if(keyword == "id"){
      //  std::cout <<"keyword: m_id " << '\n';
          ss >> id;

        }


        if(keyword == "pos"){
  //      std::cout <<"keyword: m_pos " << '\n';

          ss >> m_position.x;
          ss >> m_position.y;
          ss >> m_position.dis;

        }
//        std::cout <<"keyword: m_pos.y "<< m_position.y << '\n';


        bool displayed = true;

        if(keyword == "dis_sample"){
//          std::cout <<"keyword: displayed_sample " << '\n';

//          ss >> displayed_sample.id;
          ss >> displayed_sample.x;
          ss >> displayed_sample.y;
          ss >> displayed_sample.dis;
          if(displayed_sample.dis == 99999){
            displayed = false;
          }
        }
/*
        int sample_amount;

        if(keyword == "sample_amount"){
  //        std::cout <<"keyword: sample_ammount " << '\n';

          ss >> sample_amount;
        }

        if(keyword == "pos"){
    //      std::cout <<"keyword: pos " << '\n';


          ss >> sample_position.id;
          ss >> sample_position.x;
          ss >> sample_position.y;
          ss >> sample_position.dis;

          sampled_positions.push_back(sample_position);

        }
*/
        if(keyword == "---"){
    //      std::cout <<"keyword: --- " << '\n';

          Mirror incomming_mirror;

          incomming_mirror.id = id;
          incomming_mirror._position = m_position;
          incomming_mirror._displayed_sample = displayed_sample;
//          incomming_mirror._ammount_of_matching_samples = sample_amount;
//          incomming_mirror._matching_samples = sampled_positions;
//          incomming_mirror.has_sample = displayed;

          loadedMirrors.push_back(incomming_mirror);

        }
      }
    }
    return loadedMirrors;
  }